

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall
midi_container::scan_for_loops
          (midi_container *this,bool p_xmi_loops,bool p_marker_loops,bool p_rpgmaker_loops,
          bool p_touhou_loops)

{
  value_type vVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  midi_track *pmVar5;
  size_type sVar6;
  reference pvVar7;
  midi_event *pmVar8;
  unsigned_long uVar9;
  reference pvVar10;
  reference this_00;
  size_t sVar11;
  bool bVar12;
  size_type local_138;
  unsigned_long timestamp;
  midi_track *track_4;
  unsigned_long j_4;
  unsigned_long timestamp_song_end;
  unsigned_long i_5;
  unsigned_long data_count;
  midi_event *event_3;
  unsigned_long j_3;
  midi_track *track_3;
  unsigned_long subsong_2;
  unsigned_long i_4;
  midi_event *event_2;
  unsigned_long j_2;
  midi_track *track_2;
  unsigned_long subsong_1;
  unsigned_long i_3;
  midi_event *event_1;
  unsigned_long j_1;
  midi_track *track_1;
  unsigned_long subsong;
  unsigned_long i_2;
  bool emidi_commands_found;
  midi_event *event;
  unsigned_long j;
  midi_track *track;
  unsigned_long i_1;
  bool errored;
  bool loop_end_found;
  size_type sStack_50;
  bool loop_start_found;
  unsigned_long i;
  unsigned_long subsong_count;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  bool p_touhou_loops_local;
  bool p_rpgmaker_loops_local;
  bool p_marker_loops_local;
  bool p_xmi_loops_local;
  midi_container *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = p_touhou_loops;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = p_rpgmaker_loops;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = p_marker_loops;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = p_xmi_loops;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&subsong_count);
  if (this->m_form == 2) {
    local_138 = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks);
  }
  else {
    local_138 = 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_timestamp_loop_start,local_138);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->m_timestamp_loop_end,local_138);
  for (sStack_50 = 0; sStack_50 < local_138; sStack_50 = sStack_50 + 1) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_timestamp_loop_start,sStack_50);
    *pvVar4 = 0xffffffffffffffff;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_timestamp_loop_end,sStack_50);
    *pvVar4 = 0xffffffffffffffff;
  }
  if (((data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_1_ & 1) != 0) && (this->m_form == 0)) {
    bVar2 = false;
    track = (midi_track *)0x0;
    while( true ) {
      bVar12 = false;
      if (!bVar2) {
        pmVar5 = (midi_track *)
                 std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks);
        bVar12 = track < pmVar5;
      }
      if (!bVar12) break;
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,(size_type)track);
      event = (midi_event *)0x0;
LAB_0010a121:
      bVar12 = false;
      if (!bVar2) {
        pmVar8 = (midi_event *)midi_track::get_count(pvVar7);
        bVar12 = event < pmVar8;
      }
      if (!bVar12) goto LAB_0010a245;
      pmVar8 = midi_track::operator[](pvVar7,(size_t)event);
      if (pmVar8->m_type != control_change) goto LAB_0010a232;
      if (pmVar8->m_data[0] != '\x02') {
LAB_0010a1dd:
        if (pmVar8->m_data[0] == '\x04') {
          if (pmVar8->m_data[1] != '\0') {
            bVar2 = true;
            goto LAB_0010a245;
          }
          uVar9 = pmVar8->m_timestamp;
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_timestamp_loop_end,0);
          *pvVar4 = uVar9;
        }
LAB_0010a232:
        event = (midi_event *)((long)&event->m_timestamp + 1);
        goto LAB_0010a121;
      }
      if (pmVar8->m_data[1] == '\0') {
        uVar9 = pmVar8->m_timestamp;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_start,0);
        *pvVar4 = uVar9;
        goto LAB_0010a1dd;
      }
      bVar2 = true;
LAB_0010a245:
      track = (midi_track *)
              ((long)&(track->m_events).super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
    }
    if (bVar2) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_start,0);
      *pvVar4 = 0xffffffffffffffff;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_end,0);
      *pvVar4 = 0xffffffffffffffff;
    }
  }
  if ((data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
    bVar2 = false;
    for (subsong = 0;
        sVar6 = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks),
        subsong < sVar6; subsong = subsong + 1) {
      track_1 = (midi_track *)0x0;
      if (this->m_form == 2) {
        track_1 = (midi_track *)subsong;
      }
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,subsong);
      for (event_1 = (midi_event *)0x0; pmVar8 = (midi_event *)midi_track::get_count(pvVar7),
          event_1 < pmVar8; event_1 = (midi_event *)((long)&event_1->m_timestamp + 1)) {
        pmVar8 = midi_track::operator[](pvVar7,(size_t)event_1);
        if ((pmVar8->m_type == control_change) &&
           ((pmVar8->m_data[0] == 'n' || (pmVar8->m_data[0] == 'o')))) {
          if (pmVar8->m_data[0] == 'n') {
            bVar2 = true;
            break;
          }
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_timestamp_loop_start,(size_type)track_1);
          if ((*pvVar4 == 0xffffffffffffffff) ||
             (pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->m_timestamp_loop_start,(size_type)track_1),
             pmVar8->m_timestamp < *pvVar4)) {
            uVar9 = pmVar8->m_timestamp;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_timestamp_loop_start,(size_type)track_1);
            *pvVar4 = uVar9;
          }
        }
      }
      if (bVar2) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_start,(size_type)track_1);
        *pvVar4 = 0xffffffffffffffff;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_end,(size_type)track_1);
        *pvVar4 = 0xffffffffffffffff;
        break;
      }
    }
  }
  if ((data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    for (subsong_1 = 0;
        sVar6 = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks),
        subsong_1 < sVar6; subsong_1 = subsong_1 + 1) {
      track_2 = (midi_track *)0x0;
      if (this->m_form == 2) {
        track_2 = (midi_track *)subsong_1;
      }
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,subsong_1);
      for (event_2 = (midi_event *)0x0; pmVar8 = (midi_event *)midi_track::get_count(pvVar7),
          event_2 < pmVar8; event_2 = (midi_event *)((long)&event_2->m_timestamp + 1)) {
        pmVar8 = midi_track::operator[](pvVar7,(size_t)event_2);
        if (((pmVar8->m_type == control_change) && (0x73 < pmVar8->m_data[0])) &&
           (pmVar8->m_data[0] < 0x78)) {
          if ((pmVar8->m_data[0] == 't') || (pmVar8->m_data[0] == 'v')) {
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_timestamp_loop_start,(size_type)track_2);
            if ((*pvVar4 == 0xffffffffffffffff) ||
               (pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&this->m_timestamp_loop_start,(size_type)track_2),
               pmVar8->m_timestamp < *pvVar4)) {
              uVar9 = pmVar8->m_timestamp;
              pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->m_timestamp_loop_start,(size_type)track_2);
              *pvVar4 = uVar9;
            }
          }
          else {
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&this->m_timestamp_loop_end,(size_type)track_2);
            if ((*pvVar4 == 0xffffffffffffffff) ||
               (pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&this->m_timestamp_loop_end,(size_type)track_2),
               *pvVar4 < pmVar8->m_timestamp)) {
              uVar9 = pmVar8->m_timestamp;
              pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->m_timestamp_loop_end,(size_type)track_2);
              *pvVar4 = uVar9;
            }
          }
        }
      }
    }
  }
  if ((data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    for (subsong_2 = 0;
        sVar6 = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks),
        subsong_2 < sVar6; subsong_2 = subsong_2 + 1) {
      track_3 = (midi_track *)0x0;
      if (this->m_form == 2) {
        track_3 = (midi_track *)subsong_2;
      }
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,subsong_2);
      for (event_3 = (midi_event *)0x0; pmVar8 = (midi_event *)midi_track::get_count(pvVar7),
          event_3 < pmVar8; event_3 = (midi_event *)((long)&event_3->m_timestamp + 1)) {
        pmVar8 = midi_track::operator[](pvVar7,(size_t)event_3);
        if ((((pmVar8->m_type == extended) &&
             (uVar9 = midi_event::get_data_count(pmVar8), 8 < uVar9)) && (pmVar8->m_data[0] == 0xff)
            ) && (pmVar8->m_data[1] == '\x06')) {
          uVar9 = midi_event::get_data_count(pmVar8);
          sVar6 = uVar9 - 2;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&subsong_count,sVar6);
          pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &subsong_count,0);
          midi_event::copy_data(pmVar8,pvVar10,2,sVar6);
          if (sVar6 == 9) {
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &subsong_count,0);
            iVar3 = strncasecmp((char *)pvVar10,"loopStart",9);
            if (iVar3 == 0) {
              pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->m_timestamp_loop_start,(size_type)track_3);
              if ((*pvVar4 == 0xffffffffffffffff) ||
                 (pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                     (&this->m_timestamp_loop_start,(size_type)track_3),
                 pmVar8->m_timestamp < *pvVar4)) {
                uVar9 = pmVar8->m_timestamp;
                pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                   (&this->m_timestamp_loop_start,(size_type)track_3);
                *pvVar4 = uVar9;
              }
              goto LAB_0010aa2a;
            }
          }
          if (sVar6 == 7) {
            pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 &subsong_count,0);
            iVar3 = strncasecmp((char *)pvVar10,"loopEnd",7);
            if ((iVar3 == 0) &&
               ((pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&this->m_timestamp_loop_end,(size_type)track_3),
                *pvVar4 == 0xffffffffffffffff ||
                (pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (&this->m_timestamp_loop_end,(size_type)track_3),
                *pvVar4 < pmVar8->m_timestamp)))) {
              uVar9 = pmVar8->m_timestamp;
              pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&this->m_timestamp_loop_end,(size_type)track_3);
              *pvVar4 = uVar9;
            }
          }
        }
LAB_0010aa2a:
      }
    }
  }
  for (timestamp_song_end = 0; timestamp_song_end < local_138;
      timestamp_song_end = timestamp_song_end + 1) {
    if (this->m_form == 2) {
      pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                         (&this->m_tracks,timestamp_song_end);
      this_00 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                          (&this->m_tracks,timestamp_song_end);
      sVar11 = midi_track::get_count(this_00);
      pmVar8 = midi_track::operator[](pvVar7,sVar11 - 1);
      j_4 = pmVar8->m_timestamp;
    }
    else {
      j_4 = 0;
      for (track_4 = (midi_track *)0x0;
          pmVar5 = (midi_track *)
                   std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks),
          track_4 < pmVar5;
          track_4 = (midi_track *)
                    ((long)&(track_4->m_events).
                            super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
                            super__Vector_impl_data._M_start + 1)) {
        pvVar7 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                           (&this->m_tracks,(size_type)track_4);
        sVar11 = midi_track::get_count(pvVar7);
        pmVar8 = midi_track::operator[](pvVar7,sVar11 - 1);
        if (j_4 < pmVar8->m_timestamp) {
          j_4 = pmVar8->m_timestamp;
        }
      }
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_timestamp_loop_start,timestamp_song_end);
    if (*pvVar4 != 0xffffffffffffffff) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_start,timestamp_song_end);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_timestamp_loop_end,timestamp_song_end);
      if ((vVar1 == *pvVar4) ||
         (pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&this->m_timestamp_loop_start,timestamp_song_end), *pvVar4 == j_4)) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_start,timestamp_song_end);
        *pvVar4 = 0xffffffffffffffff;
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->m_timestamp_loop_end,timestamp_song_end);
        *pvVar4 = 0xffffffffffffffff;
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&subsong_count);
  return;
}

Assistant:

void midi_container::scan_for_loops( bool p_xmi_loops, bool p_marker_loops, bool p_rpgmaker_loops, bool p_touhou_loops )
{
    std::vector<uint8_t> data;

    unsigned long subsong_count = m_form == 2 ? m_tracks.size() : 1;

    m_timestamp_loop_start.resize( subsong_count );
    m_timestamp_loop_end.resize( subsong_count );

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        m_timestamp_loop_start[ i ] = ~0UL;
        m_timestamp_loop_end[ i ] = ~0UL;
    }

    if ( p_touhou_loops && m_form == 0 )
    {
        bool loop_start_found = false;
        bool loop_end_found = false;
        bool errored = false;

        for ( unsigned long i = 0; !errored && i < m_tracks.size(); ++i )
        {
            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; !errored && j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change )
                {
                    if ( event.m_data[ 0 ] == 2 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_start[ 0 ] = event.m_timestamp;
                        loop_start_found = true;
                    }
                    if ( event.m_data[ 0 ] == 4 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_end[ 0 ] = event.m_timestamp;
                        loop_end_found = true;
                    }
                }
            }
        }

        if ( errored )
        {
            m_timestamp_loop_start[ 0 ] = ~0UL;
            m_timestamp_loop_end[ 0 ] = ~0UL;
        }
    }

    if ( p_rpgmaker_loops )
    {
        bool emidi_commands_found = false;

        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] == 110 || event.m_data[ 0 ] == 111 ) )
                {
                    if ( event.m_data[ 0 ] == 110 )
                    {
                        emidi_commands_found = true;
                        break;
                    }
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }

            if ( emidi_commands_found )
            {
                m_timestamp_loop_start[ subsong ] = ~0UL;
                m_timestamp_loop_end[ subsong ] = ~0UL;
                break;
            }
        }
    }

    if ( p_xmi_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] >= 0x74 && event.m_data[ 0 ] <= 0x77 ) )
                {
                    if ( event.m_data[ 0 ] == 0x74 || event.m_data[ 0 ] == 0x76 )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    if ( p_marker_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::extended &&
                    event.get_data_count() >= 9 &&
                    event.m_data[ 0 ] == 0xFF && event.m_data[ 1 ] == 0x06 )
                {
                    unsigned long data_count = event.get_data_count() - 2;
                    data.resize( data_count );
                    event.copy_data( &data[0], 2, data_count );

                    if ( data_count == 9 && !strncasecmp( (const char *) &data[0], "loopStart", 9 ) )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else if ( data_count == 7 && !strncasecmp( (const char *) &data[0], "loopEnd", 7 ) )
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    // Sanity

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        unsigned long timestamp_song_end;
        if ( m_form == 2 )
            timestamp_song_end = m_tracks[i][m_tracks[i].get_count()-1].m_timestamp;
        else
        {
            timestamp_song_end = 0;
            for (unsigned long j = 0; j < m_tracks.size(); ++j)
            {
                const midi_track & track = m_tracks[j];
                unsigned long timestamp = track[track.get_count()-1].m_timestamp;
                if (timestamp > timestamp_song_end)
                    timestamp_song_end = timestamp;
            }
        }
        if ( m_timestamp_loop_start[ i ] != ~0UL && ( ( m_timestamp_loop_start[ i ] == m_timestamp_loop_end[ i ] ) || ( m_timestamp_loop_start[ i ] == timestamp_song_end ) ) )
        {
            m_timestamp_loop_start[ i ] = ~0UL;
            m_timestamp_loop_end[ i ] = ~0UL;
        }
    }
}